

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall
GlobOpt::CaptureArguments
          (GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo,JitArenaAllocator *allocator)

{
  code *pcVar1;
  bool bVar2;
  SymID id_00;
  undefined4 *puVar3;
  JitArenaAllocator *alloc;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_78;
  StackSym *local_50;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  JitArenaAllocator *allocator_local;
  BailOutInfo *bailOutInfo_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  __startIndex = ((this->currentBlock->globOptData).argObjSyms)->head;
  while( true ) {
    if (__startIndex == (Type_conflict)0x0) {
      return;
    }
    _unit.word._0_4_ = __startIndex->startIndex;
    stackSym = (StackSym *)(__startIndex->data).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    while (_unit.word._4_4_ != 0xffffffff) {
      id_00 = (Type)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
      local_50 = SymTable::FindStackSym(this->func->m_symTable,id_00);
      if (local_50 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x123,"(stackSym != nullptr)","stackSym != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      bVar2 = StackSym::HasByteCodeRegSlot(local_50);
      if (bVar2) {
        if (bailOutInfo->capturedValues->argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_78,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                     ,299);
          alloc = (JitArenaAllocator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)allocator,&local_78);
          this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
          BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,allocator);
          bailOutInfo->capturedValues->argObjSyms = this_00;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(bailOutInfo->capturedValues->argObjSyms,id_00);
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    }
    if (__startIndex == (Type_conflict)0x0) break;
    __startIndex = __startIndex->next;
  }
  return;
}

Assistant:

void
GlobOpt::CaptureArguments(BasicBlock *block, BailOutInfo * bailOutInfo, JitArenaAllocator *allocator)
{
    FOREACH_BITSET_IN_SPARSEBV(id, this->currentBlock->globOptData.argObjSyms)
    {
        StackSym * stackSym = this->func->m_symTable->FindStackSym(id);
        Assert(stackSym != nullptr);
        if (!stackSym->HasByteCodeRegSlot())
        {
            continue;
        }

        if (!bailOutInfo->capturedValues->argObjSyms)
        {
            bailOutInfo->capturedValues->argObjSyms = JitAnew(allocator, BVSparse<JitArenaAllocator>, allocator);
        }

        bailOutInfo->capturedValues->argObjSyms->Set(id);
        // Add to BailOutInfo
    }
    NEXT_BITSET_IN_SPARSEBV
}